

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a982c5::Scenario::Check
          (Scenario *this,NodeId peer,vector<GenTxid,_std::allocator<GenTxid>_> *expected,
          size_t candidates,size_t inflight,size_t completed,string *checkname,microseconds offset)

{
  pointer *pppVar1;
  pointer pcVar2;
  size_type *psVar3;
  Runner *pRVar4;
  pointer ppVar5;
  pointer ppVar6;
  _Manager_type p_Var7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar10;
  pointer ppVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_class_112_9_1179051b *__args_1;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__cur;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar13;
  pointer __a;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  long *local_90 [2];
  long local_80 [2];
  vector<GenTxid,_std::allocator<GenTxid>_> local_70;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (this->m_testname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (this->m_testname)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_c8," ");
  pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_c8,(checkname->_M_dataplus)._M_p,checkname->_M_string_length);
  local_58 = &local_48;
  psVar3 = (size_type *)(pbVar9->_M_dataplus)._M_p;
  paVar12 = &pbVar9->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar12) {
    local_48 = paVar12->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&pbVar9->field_2 + 8);
  }
  else {
    local_48 = paVar12->_M_allocated_capacity;
    local_58 = psVar3;
  }
  local_50 = pbVar9->_M_string_length;
  (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar9->_M_string_length = 0;
  (pbVar9->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (0 < offset.__r) {
    __assert_fail("offset.count() <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
                  ,0xaa,
                  "void (anonymous namespace)::Scenario::Check(NodeId, const std::vector<GenTxid> &, size_t, size_t, size_t, const std::string &, std::chrono::microseconds)"
                 );
  }
  pRVar4 = this->m_runner;
  local_c8.field_2._M_allocated_capacity = (this->m_now).__r;
  local_c8.field_2._8_8_ = offset.__r;
  local_90[0] = local_80;
  local_c8._M_dataplus._M_p = (pointer)pRVar4;
  local_c8._M_string_length = peer;
  local_a8 = candidates;
  local_a0 = inflight;
  local_98 = completed;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_58,(pointer)(local_50 + (long)local_58));
  _GLOBAL__N_1::std::vector<GenTxid,_std::allocator<GenTxid>_>::vector(&local_70,expected);
  __a = (pRVar4->actions).
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (__a == (pRVar4->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(&pRVar4->actions,1,"vector::_M_realloc_insert");
    ppVar5 = (pRVar4->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (pRVar4->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__n == 0) {
      ppVar10 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                 *)0x0;
    }
    else {
      ppVar10 = __gnu_cxx::
                new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                            *)&pRVar4->actions,__n,(void *)0x0);
    }
    __args_1 = (anon_class_112_9_1179051b *)((long)__a - (long)ppVar5 >> 3);
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
              ((allocator_type *)(&ppVar10->first + (long)__args_1),
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)(this->m_now).__r,(duration<long,_std::ratio<1L,_1000000L>_> *)&local_c8,__args_1)
    ;
    ppVar13 = ppVar10;
    for (ppVar11 = ppVar5; ppVar11 != __a; ppVar11 = ppVar11 + 1) {
      (ppVar13->first).__r = (ppVar11->first).__r;
      *(undefined8 *)&(ppVar13->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar13->second).super__Function_base._M_functor + 8) = 0;
      (ppVar13->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar13->second)._M_invoker = (ppVar11->second)._M_invoker;
      p_Var7 = (ppVar11->second).super__Function_base._M_manager;
      if (p_Var7 != (_Manager_type)0x0) {
        uVar8 = *(undefined8 *)((long)&(ppVar11->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar13->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar11->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar13->second).super__Function_base._M_functor + 8) = uVar8;
        (ppVar13->second).super__Function_base._M_manager = p_Var7;
        (ppVar11->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar11->second)._M_invoker = (_Invoker_type)0x0;
      }
      ppVar13 = ppVar13 + 1;
    }
    for (; ppVar13 = ppVar13 + 1, ppVar6 != __a; __a = __a + 1) {
      (ppVar13->first).__r = (__a->first).__r;
      *(undefined8 *)&(ppVar13->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar13->second).super__Function_base._M_functor + 8) = 0;
      (ppVar13->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar13->second)._M_invoker = (__a->second)._M_invoker;
      p_Var7 = (__a->second).super__Function_base._M_manager;
      if (p_Var7 != (_Manager_type)0x0) {
        uVar8 = *(undefined8 *)((long)&(__a->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar13->second).super__Function_base._M_functor =
             *(undefined8 *)&(__a->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar13->second).super__Function_base._M_functor + 8) = uVar8;
        (ppVar13->second).super__Function_base._M_manager = p_Var7;
        (__a->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (__a->second)._M_invoker = (_Invoker_type)0x0;
      }
    }
    if (ppVar5 != (pointer)0x0) {
      operator_delete(ppVar5,(long)(pRVar4->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar5
                     );
    }
    (pRVar4->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar10;
    (pRVar4->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
    (pRVar4->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar10 + __n;
  }
  else {
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
              ((allocator_type *)__a,
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)(this->m_now).__r,(duration<long,_std::ratio<1L,_1000000L>_> *)&local_c8,
               (anon_class_112_9_1179051b *)peer);
    pppVar1 = &(pRVar4->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Check(NodeId peer, const std::vector<GenTxid>& expected, size_t candidates, size_t inflight,
        size_t completed, const std::string& checkname,
        std::chrono::microseconds offset = std::chrono::microseconds{0})
    {
        const auto comment = m_testname + " " + checkname;
        auto& runner = m_runner;
        const auto now = m_now;
        assert(offset.count() <= 0);
        runner.actions.emplace_back(m_now, [=,&runner]() {
            std::vector<std::pair<NodeId, GenTxid>> expired_now;
            auto ret = runner.txrequest.GetRequestable(peer, now + offset, &expired_now);
            for (const auto& entry : expired_now) runner.expired.insert(entry);
            runner.txrequest.SanityCheck();
            runner.txrequest.PostGetRequestableSanityCheck(now + offset);
            size_t total = candidates + inflight + completed;
            size_t real_total = runner.txrequest.Count(peer);
            size_t real_candidates = runner.txrequest.CountCandidates(peer);
            size_t real_inflight = runner.txrequest.CountInFlight(peer);
            BOOST_CHECK_MESSAGE(real_total == total, strprintf("[" + comment + "] total %i (%i expected)", real_total, total));
            BOOST_CHECK_MESSAGE(real_inflight == inflight, strprintf("[" + comment + "] inflight %i (%i expected)", real_inflight, inflight));
            BOOST_CHECK_MESSAGE(real_candidates == candidates, strprintf("[" + comment + "] candidates %i (%i expected)", real_candidates, candidates));
            BOOST_CHECK_MESSAGE(ret == expected, "[" + comment + "] mismatching requestables");
        });
    }